

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix-top.c
# Opt level: O0

void usage(void)

{
  fprintf(_stdout,
          "usage: %s [options]\n  options:\n    -s, --symbol symbol          Ticker symbol to listen to.\n    -m, --max-orders number      Maximum number of orders per symbol (for pre-allocation).\n    -P, --proto proto            Market data protocol listen to.\n    -a, --multicast-addr addr    UDP multicast address to listen to.\n    -p, --multicast-port port    UDP multicast port to listen to.\n    -h, --help                   display this help and exit\n"
          ,program);
  exit(1);
}

Assistant:

static void usage(void)
{
	fprintf(stdout,
		"usage: %s [options]\n"
		"  options:\n"
		"    -s, --symbol symbol          Ticker symbol to listen to.\n"
		"    -m, --max-orders number      Maximum number of orders per symbol (for pre-allocation).\n"
		"    -P, --proto proto            Market data protocol listen to.\n"
		"    -a, --multicast-addr addr    UDP multicast address to listen to.\n"
		"    -p, --multicast-port port    UDP multicast port to listen to.\n"
		"    -h, --help                   display this help and exit\n",
		program);
	exit(1);
}